

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O1

void __thiscall QDialogPrivate::hideDefault(QDialogPrivate *this)

{
  ulong uVar1;
  long in_FS_OFFSET;
  QList<QPushButton_*> list;
  QArrayData *local_28;
  long lStack_20;
  ulong local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QArrayData *)0x0;
  lStack_20 = 0;
  local_18 = 0;
  qt_qFindChildren_helper
            (*(undefined8 *)&(this->super_QWidgetPrivate).field_0x8,0,0,
             &QPushButton::staticMetaObject,&local_28,1);
  if (local_18 != 0) {
    uVar1 = 0;
    do {
      QPushButton::setDefault(*(QPushButton **)(lStack_20 + uVar1 * 8),false);
      uVar1 = uVar1 + 1;
    } while (uVar1 < local_18);
  }
  if (local_28 != (QArrayData *)0x0) {
    LOCK();
    (local_28->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_28,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogPrivate::hideDefault()
{
    Q_Q(QDialog);
    QList<QPushButton*> list = q->findChildren<QPushButton*>();
    for (int i=0; i<list.size(); ++i) {
        list.at(i)->setDefault(false);
    }
}